

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxRuntime.cpp
# Opt level: O1

RuntimePtr Jinx::CreateRuntime(void)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  element_type *in_RDI;
  RuntimePtr RVar2;
  shared_ptr<Jinx::Impl::Runtime> runtime;
  undefined1 local_31;
  Runtime *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  RuntimePtr local_20;
  
  local_30 = (Runtime *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Jinx::Impl::Runtime,Jinx::Allocator<Jinx::Impl::Runtime>>
            (&local_28,&local_30,(Allocator<Jinx::Impl::Runtime> *)&local_31);
  std::__shared_ptr<Jinx::Impl::Runtime,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<Jinx::Impl::Runtime,Jinx::Impl::Runtime>
            ((__shared_ptr<Jinx::Impl::Runtime,(__gnu_cxx::_Lock_policy)2> *)&local_30,local_30);
  local_20.super___shared_ptr<Jinx::IRuntime,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_30->super_IRuntime;
  local_20.super___shared_ptr<Jinx::IRuntime,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_28._M_pi;
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28._M_pi)->_M_use_count = (local_28._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28._M_pi)->_M_use_count = (local_28._M_pi)->_M_use_count + 1;
    }
  }
  Impl::RegisterLibCore(&local_20);
  _Var1._M_pi = extraout_RDX;
  if (local_20.super___shared_ptr<Jinx::IRuntime,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<Jinx::IRuntime,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  in_RDI->_vptr_IRuntime = (_func_int **)local_30;
  in_RDI[1]._vptr_IRuntime = (_func_int **)0x0;
  in_RDI[1]._vptr_IRuntime = (_func_int **)local_28._M_pi;
  RVar2.super___shared_ptr<Jinx::IRuntime,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  RVar2.super___shared_ptr<Jinx::IRuntime,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (RuntimePtr)RVar2.super___shared_ptr<Jinx::IRuntime,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline_t RuntimePtr CreateRuntime()
	{
		auto runtime = std::allocate_shared<Impl::Runtime>(Allocator<Impl::Runtime>());
		Impl::RegisterLibCore(runtime);
		return runtime;
	}